

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin2.c
# Opt level: O0

int Gia_ManAnnotateUnrolling(Gia_Man_t *p,Abc_Cex_t *pCex,int fJustMax)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  Vec_Int_t *pVVar8;
  ulong uVar9;
  Gia_Obj_t *pGVar10;
  bool bVar11;
  int local_54;
  int iBit;
  int Value1;
  int Value0;
  int Value;
  int k;
  int f;
  int RetValue;
  Gia_Obj_t *pObjRo;
  Gia_Obj_t *pObjRi;
  Gia_Obj_t *pObj;
  int fJustMax_local;
  Abc_Cex_t *pCex_local;
  Gia_Man_t *p_local;
  
  if (p->vTruths != (Vec_Int_t *)0x0) {
    __assert_fail("p->vTruths == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin2.c"
                  ,0x4d,"int Gia_ManAnnotateUnrolling(Gia_Man_t *, Abc_Cex_t *, int)");
  }
  iVar2 = Gia_ManObjNum(p);
  iVar2 = Abc_BitWordNum(iVar2 << 1);
  p->nTtWords = iVar2;
  pVVar8 = Vec_IntStart((pCex->iFrame + 1) * p->nTtWords);
  p->vTruths = pVVar8;
  Gia_ManCleanMark0(p);
  Value = 0;
  local_54 = pCex->nRegs;
  for (; Value <= pCex->iFrame; Value = Value + 1) {
    Value0 = 0;
    while( true ) {
      iVar2 = Gia_ManPiNum(p);
      bVar11 = false;
      if (Value0 < iVar2) {
        pObjRi = Gia_ManCi(p,Value0);
        bVar11 = pObjRi != (Gia_Obj_t *)0x0;
      }
      if (!bVar11) break;
      uVar3 = Abc_InfoHasBit((uint *)(pCex + 1),local_54);
      *(ulong *)pObjRi = *(ulong *)pObjRi & 0xffffffffbfffffff | ((ulong)uVar3 & 1) << 0x1e;
      if ((int)((ulong)uVar3 & 1) != 0) {
        Gia_ManAddTwo(p,Value,pObjRi,1);
      }
      Value0 = Value0 + 1;
      local_54 = local_54 + 1;
    }
    Value0 = 0;
    while( true ) {
      bVar11 = false;
      if (Value0 < p->nObjs) {
        pObjRi = Gia_ManObj(p,Value0);
        bVar11 = pObjRi != (Gia_Obj_t *)0x0;
      }
      if (!bVar11) break;
      iVar2 = Gia_ObjIsAnd(pObjRi);
      if (iVar2 != 0) {
        pGVar10 = Gia_ObjFanin0(pObjRi);
        uVar9 = *(ulong *)pGVar10;
        uVar3 = Gia_ObjFaninC0(pObjRi);
        pGVar10 = Gia_ObjFanin1(pObjRi);
        uVar1 = *(ulong *)pGVar10;
        uVar4 = Gia_ObjFaninC1(pObjRi);
        uVar9 = (ulong)(((uint)(uVar9 >> 0x1e) & 1 ^ uVar3) & ((uint)(uVar1 >> 0x1e) & 1 ^ uVar4)) &
                1;
        *(ulong *)pObjRi = *(ulong *)pObjRi & 0xffffffffbfffffff | uVar9 << 0x1e;
        if ((int)uVar9 != 0) {
          Gia_ManAddTwo(p,Value,pObjRi,1);
        }
      }
      Value0 = Value0 + 1;
    }
    Value0 = 0;
    while( true ) {
      iVar2 = Vec_IntSize(p->vCos);
      bVar11 = false;
      if (Value0 < iVar2) {
        pObjRi = Gia_ManCo(p,Value0);
        bVar11 = pObjRi != (Gia_Obj_t *)0x0;
      }
      if (!bVar11) break;
      pGVar10 = Gia_ObjFanin0(pObjRi);
      uVar9 = *(ulong *)pGVar10;
      uVar3 = Gia_ObjFaninC0(pObjRi);
      uVar9 = (ulong)((uint)(uVar9 >> 0x1e) & 1 ^ uVar3) & 1;
      *(ulong *)pObjRi = *(ulong *)pObjRi & 0xffffffffbfffffff | uVar9 << 0x1e;
      if ((int)uVar9 != 0) {
        Gia_ManAddTwo(p,Value,pObjRi,1);
      }
      Value0 = Value0 + 1;
    }
    if (Value == pCex->iFrame) break;
    Value0 = 0;
    while( true ) {
      iVar2 = Gia_ManRegNum(p);
      bVar11 = false;
      if (Value0 < iVar2) {
        iVar2 = Gia_ManPoNum(p);
        pObjRo = Gia_ManCo(p,iVar2 + Value0);
        bVar11 = false;
        if (pObjRo != (Gia_Obj_t *)0x0) {
          iVar2 = Gia_ManPiNum(p);
          _f = Gia_ManCi(p,iVar2 + Value0);
          bVar11 = _f != (Gia_Obj_t *)0x0;
        }
      }
      if (!bVar11) break;
      uVar9 = *(ulong *)pObjRo;
      *(ulong *)_f = *(ulong *)_f & 0xffffffffbfffffff | (ulong)((uint)(uVar9 >> 0x1e) & 1) << 0x1e;
      if ((uVar9 >> 0x1e & 1) != 0) {
        Gia_ManAddTwo(p,Value + 1,_f,1);
      }
      Value0 = Value0 + 1;
    }
  }
  if (local_54 != pCex->nBits) {
    __assert_fail("iBit == pCex->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin2.c"
                  ,99,"int Gia_ManAnnotateUnrolling(Gia_Man_t *, Abc_Cex_t *, int)");
  }
  pGVar10 = Gia_ManPo(p,pCex->iPo);
  uVar3 = (uint)(*(ulong *)pGVar10 >> 0x1e) & 1;
  if (uVar3 != 1) {
    printf("Counter-example is invalid.\n");
  }
  Gia_ManCleanMark0(p);
  pObjRi = Gia_ManPo(p,pCex->iPo);
  *(ulong *)pObjRi = *(ulong *)pObjRi & 0xffffffffbfffffff | 0x40000000;
  Gia_ManAddTwo(p,pCex->iFrame,pObjRi,2);
  for (Value = pCex->iFrame; -1 < Value; Value = Value + -1) {
    Value0 = 0;
    while( true ) {
      iVar2 = Vec_IntSize(p->vCos);
      bVar11 = false;
      if (Value0 < iVar2) {
        pObjRi = Gia_ManCo(p,Value0);
        bVar11 = pObjRi != (Gia_Obj_t *)0x0;
      }
      if (!bVar11) break;
      uVar9 = *(ulong *)pObjRi;
      pGVar10 = Gia_ObjFanin0(pObjRi);
      *(ulong *)pGVar10 =
           *(ulong *)pGVar10 & 0xffffffffbfffffff | (ulong)((uint)(uVar9 >> 0x1e) & 1) << 0x1e;
      if ((uVar9 >> 0x1e & 1) != 0) {
        *(ulong *)pObjRi = *(ulong *)pObjRi & 0xffffffffbfffffff;
        pGVar10 = Gia_ObjFanin0(pObjRi);
        Gia_ManAddTwo(p,Value,pGVar10,2);
      }
      Value0 = Value0 + 1;
    }
    Value0 = p->nObjs;
    while( true ) {
      Value0 = Value0 + -1;
      bVar11 = false;
      if (0 < Value0) {
        pObjRi = Gia_ManObj(p,Value0);
        bVar11 = pObjRi != (Gia_Obj_t *)0x0;
      }
      if (!bVar11) break;
      iVar2 = Gia_ObjIsAnd(pObjRi);
      if ((iVar2 != 0) && ((*(ulong *)pObjRi >> 0x1e & 1) != 0)) {
        *(ulong *)pObjRi = *(ulong *)pObjRi & 0xffffffffbfffffff;
        uVar4 = Gia_ManGetTwo(p,Value,pObjRi);
        uVar4 = uVar4 & 1;
        pGVar10 = Gia_ObjFanin0(pObjRi);
        uVar5 = Gia_ManGetTwo(p,Value,pGVar10);
        uVar6 = Gia_ObjFaninC0(pObjRi);
        uVar6 = uVar5 & 1 ^ uVar6;
        pGVar10 = Gia_ObjFanin1(pObjRi);
        uVar5 = Gia_ManGetTwo(p,Value,pGVar10);
        uVar7 = Gia_ObjFaninC1(pObjRi);
        uVar7 = uVar5 & 1 ^ uVar7;
        if (uVar6 == uVar7) {
          if (uVar4 != (uVar6 & uVar7)) {
            __assert_fail("Value == (Value0 & Value1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin2.c"
                          ,0x81,"int Gia_ManAnnotateUnrolling(Gia_Man_t *, Abc_Cex_t *, int)");
          }
          if ((fJustMax == 0) && (uVar4 != 1)) {
            pGVar10 = Gia_ObjFanin0(pObjRi);
            *(ulong *)pGVar10 = *(ulong *)pGVar10 & 0xffffffffbfffffff | 0x40000000;
            pGVar10 = Gia_ObjFanin0(pObjRi);
            Gia_ManAddTwo(p,Value,pGVar10,2);
          }
          else {
            pGVar10 = Gia_ObjFanin1(pObjRi);
            *(ulong *)pGVar10 = *(ulong *)pGVar10 & 0xffffffffbfffffff | 0x40000000;
            pGVar10 = Gia_ObjFanin0(pObjRi);
            *(ulong *)pGVar10 = *(ulong *)pGVar10 & 0xffffffffbfffffff | 0x40000000;
            pGVar10 = Gia_ObjFanin0(pObjRi);
            Gia_ManAddTwo(p,Value,pGVar10,2);
            pGVar10 = Gia_ObjFanin1(pObjRi);
            Gia_ManAddTwo(p,Value,pGVar10,2);
          }
        }
        else if (uVar6 == 0) {
          if (uVar4 != 0) {
            __assert_fail("Value == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin2.c"
                          ,0x90,"int Gia_ManAnnotateUnrolling(Gia_Man_t *, Abc_Cex_t *, int)");
          }
          pGVar10 = Gia_ObjFanin0(pObjRi);
          *(ulong *)pGVar10 = *(ulong *)pGVar10 & 0xffffffffbfffffff | 0x40000000;
          pGVar10 = Gia_ObjFanin0(pObjRi);
          Gia_ManAddTwo(p,Value,pGVar10,2);
        }
        else {
          if (uVar7 != 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin2.c"
                          ,0x9a,"int Gia_ManAnnotateUnrolling(Gia_Man_t *, Abc_Cex_t *, int)");
          }
          if (uVar4 != 0) {
            __assert_fail("Value == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin2.c"
                          ,0x96,"int Gia_ManAnnotateUnrolling(Gia_Man_t *, Abc_Cex_t *, int)");
          }
          pGVar10 = Gia_ObjFanin1(pObjRi);
          *(ulong *)pGVar10 = *(ulong *)pGVar10 & 0xffffffffbfffffff | 0x40000000;
          pGVar10 = Gia_ObjFanin1(pObjRi);
          Gia_ManAddTwo(p,Value,pGVar10,2);
        }
      }
    }
    if (Value == 0) break;
    Value0 = 0;
    while( true ) {
      iVar2 = Gia_ManPiNum(p);
      bVar11 = false;
      if (Value0 < iVar2) {
        pObjRi = Gia_ManCi(p,Value0);
        bVar11 = pObjRi != (Gia_Obj_t *)0x0;
      }
      if (!bVar11) break;
      *(ulong *)pObjRi = *(ulong *)pObjRi & 0xffffffffbfffffff;
      Value0 = Value0 + 1;
    }
    Value0 = 0;
    while( true ) {
      iVar2 = Gia_ManRegNum(p);
      bVar11 = false;
      if (Value0 < iVar2) {
        iVar2 = Gia_ManPoNum(p);
        pObjRo = Gia_ManCo(p,iVar2 + Value0);
        bVar11 = false;
        if (pObjRo != (Gia_Obj_t *)0x0) {
          iVar2 = Gia_ManPiNum(p);
          _f = Gia_ManCi(p,iVar2 + Value0);
          bVar11 = _f != (Gia_Obj_t *)0x0;
        }
      }
      if (!bVar11) break;
      uVar9 = *(ulong *)_f;
      *(ulong *)pObjRo =
           *(ulong *)pObjRo & 0xffffffffbfffffff | (ulong)((uint)(uVar9 >> 0x1e) & 1) << 0x1e;
      if ((uVar9 >> 0x1e & 1) != 0) {
        *(ulong *)_f = *(ulong *)_f & 0xffffffffbfffffff;
        Gia_ManAddTwo(p,Value + -1,pObjRo,2);
      }
      Value0 = Value0 + 1;
    }
  }
  Gia_ManCleanMark0(p);
  return uVar3;
}

Assistant:

int Gia_ManAnnotateUnrolling( Gia_Man_t * p, Abc_Cex_t * pCex, int fJustMax )
{
    Gia_Obj_t * pObj, * pObjRi, * pObjRo;
    int RetValue, f, k, Value, Value0, Value1, iBit;
    // start storage for internal info
    assert( p->vTruths == NULL );
    p->nTtWords = Abc_BitWordNum( 2 * Gia_ManObjNum(p) );
    p->vTruths  = Vec_IntStart( (pCex->iFrame + 1) * p->nTtWords );
    // assign values to all objects (const0 and RO in frame0 are assigned 0)
    Gia_ManCleanMark0(p);
    for ( f = 0, iBit = pCex->nRegs; f <= pCex->iFrame; f++ )
    {
        Gia_ManForEachPi( p, pObj, k )
            if ( (pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++)) )
                Gia_ManAddTwo( p, f, pObj, 1 );
        Gia_ManForEachAnd( p, pObj, k )
            if ( (pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj))) )
                Gia_ManAddTwo( p, f, pObj, 1 );
        Gia_ManForEachCo( p, pObj, k )
            if ( (pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) )
                Gia_ManAddTwo( p, f, pObj, 1 );
        if ( f == pCex->iFrame )
            break;
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            if ( (pObjRo->fMark0 = pObjRi->fMark0) )
                Gia_ManAddTwo( p, f+1, pObjRo, 1 );
    }
    assert( iBit == pCex->nBits );
    // check the output value
    RetValue = Gia_ManPo(p, pCex->iPo)->fMark0;
    if ( RetValue != 1 )
        printf( "Counter-example is invalid.\n" );
    // assign justification to nodes
    Gia_ManCleanMark0(p);
    pObj = Gia_ManPo(p, pCex->iPo);
    pObj->fMark0 = 1;
    Gia_ManAddTwo( p, pCex->iFrame, pObj, 2 );
    for ( f = pCex->iFrame; f >= 0; f-- )
    {
        // transfer to CO drivers
        Gia_ManForEachCo( p, pObj, k )
            if ( (Gia_ObjFanin0(pObj)->fMark0 = pObj->fMark0) )
            {
                pObj->fMark0 = 0;
                Gia_ManAddTwo( p, f, Gia_ObjFanin0(pObj), 2 );
            }
        // compute justification
        Gia_ManForEachAndReverse( p, pObj, k )
        {
            if ( !pObj->fMark0 ) 
                continue;
            pObj->fMark0 = 0;
            Value = (1 & Gia_ManGetTwo(p, f, pObj));
            Value0 = (1 & Gia_ManGetTwo(p, f, Gia_ObjFanin0(pObj))) ^ Gia_ObjFaninC0(pObj);
            Value1 = (1 & Gia_ManGetTwo(p, f, Gia_ObjFanin1(pObj))) ^ Gia_ObjFaninC1(pObj);
            if ( Value0 == Value1 )
            {
                assert( Value == (Value0 & Value1) );
                if ( fJustMax || Value == 1 )
                {
                    Gia_ObjFanin0(pObj)->fMark0 = Gia_ObjFanin1(pObj)->fMark0 = 1;
                    Gia_ManAddTwo( p, f, Gia_ObjFanin0(pObj), 2 );
                    Gia_ManAddTwo( p, f, Gia_ObjFanin1(pObj), 2 );
                }
                else
                {
                    Gia_ObjFanin0(pObj)->fMark0 = 1;
                    Gia_ManAddTwo( p, f, Gia_ObjFanin0(pObj), 2 );
                }
            }
            else if ( Value0 == 0 )
            {
                assert( Value == 0 );
                Gia_ObjFanin0(pObj)->fMark0 = 1;
                Gia_ManAddTwo( p, f, Gia_ObjFanin0(pObj), 2 );
            }
            else if ( Value1 == 0 )
            {
                assert( Value == 0 );
                Gia_ObjFanin1(pObj)->fMark0 = 1;
                Gia_ManAddTwo( p, f, Gia_ObjFanin1(pObj), 2 );
            }
            else assert( 0 );
        }
        if ( f == 0 )
            break;
        // transfer to RIs
        Gia_ManForEachPi( p, pObj, k )
            pObj->fMark0 = 0;
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            if ( (pObjRi->fMark0 = pObjRo->fMark0) )
            {
                pObjRo->fMark0 = 0;
                Gia_ManAddTwo( p, f-1, pObjRi, 2 );
            }
    }
    Gia_ManCleanMark0(p);
    return RetValue;
}